

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O0

uint __thiscall BVFixed::DiffCount(BVFixed *this,BVFixed *bv)

{
  uint uVar1;
  BVIndex BVar2;
  BVUnit *pBVar3;
  bool bVar4;
  uint local_2c;
  BVUnitT<unsigned_long> *pBStack_28;
  uint count;
  BVUnit *j;
  BVUnit *i;
  BVFixed *bv_local;
  BVFixed *this_local;
  
  local_2c = 0;
  j = BeginUnit(this);
  pBStack_28 = BeginUnit(bv);
  while( true ) {
    pBVar3 = EndUnit(this);
    bVar4 = false;
    if (j != pBVar3) {
      pBVar3 = EndUnit(bv);
      bVar4 = pBStack_28 != pBVar3;
    }
    if (!bVar4) break;
    uVar1 = BVUnitT<unsigned_long>::DiffCount(j,(BVUnitT<unsigned_long>)pBStack_28->word);
    local_2c = uVar1 + local_2c;
    j = j + 1;
    pBStack_28 = pBStack_28 + 1;
  }
  for (; pBVar3 = EndUnit(this), j != pBVar3; j = j + 1) {
    BVar2 = BVUnitT<unsigned_long>::Count(j);
    local_2c = BVar2 + local_2c;
  }
  for (; pBVar3 = EndUnit(bv), pBStack_28 != pBVar3; pBStack_28 = pBStack_28 + 1) {
    BVar2 = BVUnitT<unsigned_long>::Count(pBStack_28);
    local_2c = BVar2 + local_2c;
  }
  return local_2c;
}

Assistant:

uint
BVFixed::DiffCount(const BVFixed*bv) const
{
    const BVUnit *i, *j;
    uint count = 0;
    for(i  =  this->BeginUnit(), j = bv->BeginUnit();
        i !=  this->EndUnit() && j != bv->EndUnit();
        i++, j++)
    {
        count += i->DiffCount(*j);
    }

    // Assumes that the default value of is 0
    while(i != this->EndUnit())
    {
        count += i->Count();
        i++;
    }
    while(j != bv->EndUnit())
    {
        count += j->Count();
        j++;
    }
    return count;
}